

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)

{
  sysbvm_tuple_t analysisQueue;
  sysbvm_tuple_t sVar1;
  
  sVar1 = (context->roots).globalNamespace;
  analysisQueue = sysbvm_analysisQueue_getDefault(context);
  sVar1 = sysbvm_environment_createWithAnalysisQueue(context,sVar1,analysisQueue);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)
{
    return sysbvm_environment_createWithAnalysisQueue(context,
        sysbvm_environment_getIntrinsicsBuiltInEnvironment(context),
        sysbvm_analysisQueue_getDefault(context));
}